

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::DirectStateAccess::Buffers::ClearTest::iterate(ClearTest *this)

{
  PFNGLNAMEDBUFFERDATA p_Var1;
  PFNGLCLEARNAMEDBUFFERDATA p_Var2;
  PFNGLCLEARNAMEDBUFFERSUBDATA p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ContextType ctxType;
  undefined4 extraout_var;
  undefined4 *puVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  char *description;
  byte bVar19;
  qpTestResult testResult;
  TestContext *this_00;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  GLubyte reference [4];
  undefined1 *local_88;
  undefined8 uStack_80;
  byte local_6d;
  byte local_6c;
  byte local_6b;
  byte local_6a;
  byte local_69;
  byte local_68;
  byte local_67;
  byte local_66;
  byte local_65;
  byte local_64;
  byte local_63;
  byte local_62;
  byte local_61;
  byte local_60;
  byte local_5f;
  byte local_5e;
  byte local_5d;
  byte local_5c;
  byte local_5b;
  byte local_5a;
  byte local_59;
  byte local_58;
  byte local_57;
  byte local_56;
  byte local_55;
  byte local_54;
  byte local_53;
  byte local_52;
  byte local_51;
  byte local_50;
  byte local_4f;
  byte local_4e;
  byte local_4d;
  byte local_4c;
  byte local_4b;
  byte local_4a;
  byte local_49;
  byte local_48;
  byte local_47;
  byte local_46;
  byte local_45;
  byte local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  byte local_40;
  byte local_3f;
  byte local_3e;
  byte local_3d;
  byte local_3c;
  byte local_3b;
  byte local_3a;
  byte local_39;
  byte local_38;
  byte local_37;
  byte local_36;
  byte local_35;
  byte local_34;
  byte local_33;
  byte local_32;
  byte local_31;
  long lVar10;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar9);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar5 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar4) || (bVar5)) {
    p_Var1 = *(PFNGLNAMEDBUFFERDATA *)(lVar10 + 0xec0);
    this->m_pNamedBufferData = p_Var1;
    p_Var2 = *(PFNGLCLEARNAMEDBUFFERDATA *)(lVar10 + 0x1d8);
    this->m_pClearNamedBufferData = p_Var2;
    p_Var3 = *(PFNGLCLEARNAMEDBUFFERSUBDATA *)(lVar10 + 0x1e0);
    this->m_pClearNamedBufferSubData = p_Var3;
    if ((p_Var1 == (PFNGLNAMEDBUFFERDATA)0x0) ||
       ((p_Var2 == (PFNGLCLEARNAMEDBUFFERDATA)0x0 || (p_Var3 == (PFNGLCLEARNAMEDBUFFERSUBDATA)0x0)))
       ) {
      puVar11 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar11 = 0;
      __cxa_throw(puVar11,&int::typeinfo,0);
    }
    local_88._0_4_ = 0x3020105;
    local_31 = TestClearNamedBufferData<unsigned_char,false>
                         (this,0x8229,1,0x1903,0x1401,(uchar *)&local_88);
    local_32 = TestClearNamedBufferData<unsigned_char,false>
                         (this,0x822b,2,0x8227,0x1401,(uchar *)&local_88);
    local_33 = TestClearNamedBufferData<unsigned_char,false>
                         (this,0x8058,4,0x1908,0x1401,(uchar *)&local_88);
    local_34 = TestClearNamedBufferData<unsigned_char,true>
                         (this,0x8229,1,0x1903,0x1401,(uchar *)&local_88);
    local_35 = TestClearNamedBufferData<unsigned_char,true>
                         (this,0x822b,2,0x8227,0x1401,(uchar *)&local_88);
    local_36 = TestClearNamedBufferData<unsigned_char,true>
                         (this,0x8058,4,0x1908,0x1401,(uchar *)&local_88);
    local_37 = TestClearNamedBufferData<unsigned_char,false>
                         (this,0x8232,1,0x1903,0x1401,(uchar *)&local_88);
    local_38 = TestClearNamedBufferData<unsigned_char,false>
                         (this,0x8238,2,0x8227,0x1401,(uchar *)&local_88);
    local_39 = TestClearNamedBufferData<unsigned_char,false>
                         (this,0x8d7c,4,0x1908,0x1401,(uchar *)&local_88);
    local_3a = TestClearNamedBufferData<unsigned_char,true>
                         (this,0x8232,1,0x1903,0x1401,(uchar *)&local_88);
    local_3b = TestClearNamedBufferData<unsigned_char,true>
                         (this,0x8238,2,0x8227,0x1401,(uchar *)&local_88);
    local_3c = TestClearNamedBufferData<unsigned_char,true>
                         (this,0x8d7c,4,0x1908,0x1401,(uchar *)&local_88);
    local_88 = (undefined1 *)CONCAT44(local_88._4_4_,0x3fe0105);
    local_3d = TestClearNamedBufferData<signed_char,false>
                         (this,0x8231,1,0x1903,0x1400,(char *)&local_88);
    local_3e = TestClearNamedBufferData<signed_char,false>
                         (this,0x8237,2,0x8227,0x1400,(char *)&local_88);
    local_3f = TestClearNamedBufferData<signed_char,false>
                         (this,0x8d8e,4,0x1908,0x1400,(char *)&local_88);
    local_40 = TestClearNamedBufferData<signed_char,true>
                         (this,0x8231,1,0x1903,0x1400,(char *)&local_88);
    local_41 = TestClearNamedBufferData<signed_char,true>
                         (this,0x8237,2,0x8227,0x1400,(char *)&local_88);
    local_42 = TestClearNamedBufferData<signed_char,true>
                         (this,0x8d8e,4,0x1908,0x1400,(char *)&local_88);
    local_88 = (undefined1 *)0x3000200010005;
    local_43 = TestClearNamedBufferData<unsigned_short,false>
                         (this,0x822a,1,0x1903,0x1403,(unsigned_short *)&local_88);
    local_44 = TestClearNamedBufferData<unsigned_short,false>
                         (this,0x822c,2,0x8227,0x1403,(unsigned_short *)&local_88);
    local_45 = TestClearNamedBufferData<unsigned_short,false>
                         (this,0x805b,4,0x1908,0x1403,(unsigned_short *)&local_88);
    local_46 = TestClearNamedBufferData<unsigned_short,true>
                         (this,0x822a,1,0x1903,0x1403,(unsigned_short *)&local_88);
    local_47 = TestClearNamedBufferData<unsigned_short,true>
                         (this,0x822c,2,0x8227,0x1403,(unsigned_short *)&local_88);
    local_48 = TestClearNamedBufferData<unsigned_short,true>
                         (this,0x805b,4,0x1908,0x1403,(unsigned_short *)&local_88);
    local_49 = TestClearNamedBufferData<unsigned_short,false>
                         (this,0x8234,1,0x1903,0x1403,(unsigned_short *)&local_88);
    local_4a = TestClearNamedBufferData<unsigned_short,false>
                         (this,0x823a,2,0x8227,0x1403,(unsigned_short *)&local_88);
    local_4b = TestClearNamedBufferData<unsigned_short,false>
                         (this,0x8d76,4,0x1908,0x1403,(unsigned_short *)&local_88);
    local_4c = TestClearNamedBufferData<unsigned_short,true>
                         (this,0x8234,1,0x1903,0x1403,(unsigned_short *)&local_88);
    local_4d = TestClearNamedBufferData<unsigned_short,true>
                         (this,0x823a,2,0x8227,0x1403,(unsigned_short *)&local_88);
    bVar4 = TestClearNamedBufferData<unsigned_short,true>
                      (this,0x8d76,4,0x1908,0x1403,(unsigned_short *)&local_88);
    local_88 = (undefined1 *)0x3fffe00010005;
    local_4e = TestClearNamedBufferData<short,false>(this,0x8233,1,0x1903,0x1402,(short *)&local_88)
    ;
    local_4f = TestClearNamedBufferData<short,false>(this,0x8239,2,0x8227,0x1402,(short *)&local_88)
    ;
    local_50 = TestClearNamedBufferData<short,false>(this,0x8d88,4,0x1908,0x1402,(short *)&local_88)
    ;
    local_51 = TestClearNamedBufferData<short,true>(this,0x8233,1,0x1903,0x1402,(short *)&local_88);
    local_52 = TestClearNamedBufferData<short,true>(this,0x8239,2,0x8227,0x1402,(short *)&local_88);
    local_53 = TestClearNamedBufferData<short,true>(this,0x8d88,4,0x1908,0x1402,(short *)&local_88);
    local_88 = &DAT_100000005;
    uStack_80 = 0x300000002;
    local_54 = TestClearNamedBufferData<unsigned_int,false>
                         (this,0x8236,1,0x1903,0x1405,(uint *)&local_88);
    bVar5 = TestClearNamedBufferData<unsigned_int,false>
                      (this,0x823c,2,0x8227,0x1405,(uint *)&local_88);
    local_55 = TestClearNamedBufferData<unsigned_int,false>
                         (this,0x8d71,3,0x1907,0x1405,(uint *)&local_88);
    local_56 = TestClearNamedBufferData<unsigned_int,false>
                         (this,0x8d70,4,0x1908,0x1405,(uint *)&local_88);
    local_57 = TestClearNamedBufferData<unsigned_int,true>
                         (this,0x8236,1,0x1903,0x1405,(uint *)&local_88);
    local_58 = TestClearNamedBufferData<unsigned_int,true>
                         (this,0x823c,2,0x8227,0x1405,(uint *)&local_88);
    local_59 = TestClearNamedBufferData<unsigned_int,true>
                         (this,0x8d71,3,0x1907,0x1405,(uint *)&local_88);
    local_5a = TestClearNamedBufferData<unsigned_int,true>
                         (this,0x8d70,4,0x1908,0x1405,(uint *)&local_88);
    local_88 = &DAT_100000005;
    uStack_80 = 0x3fffffffe;
    local_5b = TestClearNamedBufferData<int,false>(this,0x8235,1,0x1903,0x1404,(int *)&local_88);
    local_5c = TestClearNamedBufferData<int,false>(this,0x823b,2,0x8227,0x1404,(int *)&local_88);
    bVar6 = TestClearNamedBufferData<int,false>(this,0x8d83,3,0x1907,0x1404,(int *)&local_88);
    local_5d = TestClearNamedBufferData<int,false>(this,0x8d82,4,0x1908,0x1404,(int *)&local_88);
    local_5e = TestClearNamedBufferData<int,true>(this,0x8235,1,0x1903,0x1404,(int *)&local_88);
    local_5f = TestClearNamedBufferData<int,true>(this,0x823b,2,0x8227,0x1404,(int *)&local_88);
    local_60 = TestClearNamedBufferData<int,true>(this,0x8d83,3,0x1907,0x1404,(int *)&local_88);
    local_61 = TestClearNamedBufferData<int,true>(this,0x8d82,4,0x1908,0x1404,(int *)&local_88);
    local_88 = (undefined1 *)0x3555c00000003c00;
    local_62 = TestClearNamedBufferData<unsigned_short,false>
                         (this,0x822d,1,0x1903,0x140b,(unsigned_short *)&local_88);
    local_63 = TestClearNamedBufferData<unsigned_short,false>
                         (this,0x822f,2,0x8227,0x140b,(unsigned_short *)&local_88);
    local_64 = TestClearNamedBufferData<unsigned_short,false>
                         (this,0x881a,4,0x1908,0x140b,(unsigned_short *)&local_88);
    local_65 = TestClearNamedBufferData<unsigned_short,true>
                         (this,0x822d,1,0x1903,0x140b,(unsigned_short *)&local_88);
    bVar7 = TestClearNamedBufferData<unsigned_short,true>
                      (this,0x822f,2,0x8227,0x140b,(unsigned_short *)&local_88);
    local_66 = TestClearNamedBufferData<unsigned_short,true>
                         (this,0x881a,4,0x1908,0x140b,(unsigned_short *)&local_88);
    local_88 = (undefined1 *)0x3f800000;
    uStack_80 = 0x3eaaaaabc0000000;
    local_67 = TestClearNamedBufferData<float,false>(this,0x822e,1,0x1903,0x1406,(float *)&local_88)
    ;
    local_68 = TestClearNamedBufferData<float,false>(this,0x8230,2,0x8227,0x1406,(float *)&local_88)
    ;
    local_69 = TestClearNamedBufferData<float,false>(this,0x8815,3,0x1907,0x1406,(float *)&local_88)
    ;
    local_6a = TestClearNamedBufferData<float,false>(this,0x8814,4,0x1908,0x1406,(float *)&local_88)
    ;
    local_6b = TestClearNamedBufferData<float,true>(this,0x822e,1,0x1903,0x1406,(float *)&local_88);
    local_6c = TestClearNamedBufferData<float,true>(this,0x8230,2,0x8227,0x1406,(float *)&local_88);
    local_6d = TestClearNamedBufferData<float,true>(this,0x8815,3,0x1907,0x1406,(float *)&local_88);
    bVar8 = TestClearNamedBufferData<float,true>(this,0x8814,4,0x1908,0x1406,(float *)&local_88);
    bVar12 = local_31 & local_32;
    bVar16 = local_33 & local_34;
    bVar13 = local_35 & local_36 & local_37;
    bVar17 = local_38 & local_39 & local_3a & local_3b;
    bVar14 = local_3c & local_3d & local_3e & local_3f & local_40;
    bVar18 = local_41 & local_42 & local_43 & local_44 & local_45 & local_46;
    bVar15 = local_47 & local_48 & local_49 & local_4a & local_4b & local_4c & local_4d;
    bVar22 = bVar4 & local_4e & local_4f & local_50 & local_51 & local_52 & local_53 & local_54;
    bVar19 = bVar5 & local_55 & local_56 & local_57 & local_58 & local_59 & local_5a & local_5b &
             local_5c;
    bVar20 = bVar6 & local_5d & local_5e & local_5f & local_60 & local_61 & local_62 & local_63 &
             local_64 & local_65;
    bVar21 = bVar7 & local_66 & local_67 & local_68 & local_69 & local_6a & local_6b & local_6c &
             local_6d;
    do {
      iVar9 = (**(code **)(lVar10 + 0x800))();
    } while (iVar9 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((byte)(bVar21 & bVar8 &
              bVar20 & bVar19 & bVar22 & bVar15 & bVar18 & bVar14 & bVar17 & bVar13 & bVar16 & 
                                                  bVar12) == 0) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ClearTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	m_pNamedBufferData		   = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pClearNamedBufferData	= (PFNGLCLEARNAMEDBUFFERDATA)gl.clearNamedBufferData;
	m_pClearNamedBufferSubData = (PFNGLCLEARNAMEDBUFFERSUBDATA)gl.clearNamedBufferSubData;

	try
	{
		if ((DE_NULL == m_pNamedBufferData) || (DE_NULL == m_pClearNamedBufferData) ||
			(DE_NULL == m_pClearNamedBufferSubData))
		{
			throw 0;
		}

		{
			/* unsigned byte norm component ClearNamedBufferData tests */
			glw::GLubyte reference[4] = { 5, 1, 2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_R8, 1, GL_RED, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_RG8, 2, GL_RG, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_RGBA8, 4, GL_RGBA, GL_UNSIGNED_BYTE, reference);

			/* unsigned byte norm component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_R8, 1, GL_RED, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_RG8, 2, GL_RG, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_RGBA8, 4, GL_RGBA, GL_UNSIGNED_BYTE, reference);

			/* unsigned byte component ClearNamedBufferData tests */
			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_R8UI, 1, GL_RED, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_RG8UI, 2, GL_RG, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, false>(GL_RGBA8UI, 4, GL_RGBA, GL_UNSIGNED_BYTE, reference);

			/* unsigned byte component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_R8UI, 1, GL_RED, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_RG8UI, 2, GL_RG, GL_UNSIGNED_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLubyte, true>(GL_RGBA8UI, 4, GL_RGBA, GL_UNSIGNED_BYTE, reference);
		}

		{
			/* signed byte component ClearNamedBufferData tests */
			glw::GLbyte reference[4] = { 5, 1, -2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLbyte, false>(GL_R8I, 1, GL_RED, GL_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLbyte, false>(GL_RG8I, 2, GL_RG, GL_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLbyte, false>(GL_RGBA8I, 4, GL_RGBA, GL_BYTE, reference);

			/* signed byte component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLbyte, true>(GL_R8I, 1, GL_RED, GL_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLbyte, true>(GL_RG8I, 2, GL_RG, GL_BYTE, reference);
			is_ok &= TestClearNamedBufferData<glw::GLbyte, true>(GL_RGBA8I, 4, GL_RGBA, GL_BYTE, reference);
		}

		{
			/* unsigned short norm component ClearNamedBufferData tests */
			glw::GLushort reference[4] = { 5, 1, 2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLushort, false>(GL_R16, 1, GL_RED, GL_UNSIGNED_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLushort, false>(GL_RG16, 2, GL_RG, GL_UNSIGNED_SHORT, reference);
			is_ok &=
				TestClearNamedBufferData<glw::GLushort, false>(GL_RGBA16, 4, GL_RGBA, GL_UNSIGNED_SHORT, reference);

			/* unsigned short norm component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLushort, true>(GL_R16, 1, GL_RED, GL_UNSIGNED_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLushort, true>(GL_RG16, 2, GL_RG, GL_UNSIGNED_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLushort, true>(GL_RGBA16, 4, GL_RGBA, GL_UNSIGNED_SHORT, reference);

			/* unsigned short component ClearNamedBufferData tests */
			is_ok &= TestClearNamedBufferData<glw::GLushort, false>(GL_R16UI, 1, GL_RED, GL_UNSIGNED_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLushort, false>(GL_RG16UI, 2, GL_RG, GL_UNSIGNED_SHORT, reference);
			is_ok &=
				TestClearNamedBufferData<glw::GLushort, false>(GL_RGBA16UI, 4, GL_RGBA, GL_UNSIGNED_SHORT, reference);

			/* unsigned short component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLushort, true>(GL_R16UI, 1, GL_RED, GL_UNSIGNED_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLushort, true>(GL_RG16UI, 2, GL_RG, GL_UNSIGNED_SHORT, reference);
			is_ok &=
				TestClearNamedBufferData<glw::GLushort, true>(GL_RGBA16UI, 4, GL_RGBA, GL_UNSIGNED_SHORT, reference);
		}

		{
			/* signed short component ClearNamedBufferData tests */
			glw::GLshort reference[4] = { 5, 1, -2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLshort, false>(GL_R16I, 1, GL_RED, GL_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLshort, false>(GL_RG16I, 2, GL_RG, GL_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLshort, false>(GL_RGBA16I, 4, GL_RGBA, GL_SHORT, reference);

			/* signed short component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLshort, true>(GL_R16I, 1, GL_RED, GL_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLshort, true>(GL_RG16I, 2, GL_RG, GL_SHORT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLshort, true>(GL_RGBA16I, 4, GL_RGBA, GL_SHORT, reference);
		}

		{
			/* unsigned int component ClearNamedBufferData tests */
			glw::GLuint reference[4] = { 5, 1, 2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLuint, false>(GL_R32UI, 1, GL_RED, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, false>(GL_RG32UI, 2, GL_RG, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, false>(GL_RGB32UI, 3, GL_RGB, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, false>(GL_RGBA32UI, 4, GL_RGBA, GL_UNSIGNED_INT, reference);

			/* unsigned int component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLuint, true>(GL_R32UI, 1, GL_RED, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, true>(GL_RG32UI, 2, GL_RG, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, true>(GL_RGB32UI, 3, GL_RGB, GL_UNSIGNED_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLuint, true>(GL_RGBA32UI, 4, GL_RGBA, GL_UNSIGNED_INT, reference);
		}

		{
			/* signed int component ClearNamedBufferData tests */
			glw::GLint reference[4] = { 5, 1, -2, 3 };

			is_ok &= TestClearNamedBufferData<glw::GLint, false>(GL_R32I, 1, GL_RED, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, false>(GL_RG32I, 2, GL_RG, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, false>(GL_RGB32I, 3, GL_RGB, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, false>(GL_RGBA32I, 4, GL_RGBA, GL_INT, reference);

			/* signed int component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLint, true>(GL_R32I, 1, GL_RED, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, true>(GL_RG32I, 2, GL_RG, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, true>(GL_RGB32I, 3, GL_RGB, GL_INT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLint, true>(GL_RGBA32I, 4, GL_RGBA, GL_INT, reference);
		}

		{
			/* half float component ClearNamedBufferData tests */
			glw::GLhalf reference[4] = { 0x3C00 /* 1.0hf */, 0x0000 /* 0.0hf */, 0xC000 /* -2.0hf */,
										 0x3555 /* 0.333333333hf */ };

			is_ok &= TestClearNamedBufferData<glw::GLhalf, false>(GL_R16F, 1, GL_RED, GL_HALF_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLhalf, false>(GL_RG16F, 2, GL_RG, GL_HALF_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLhalf, false>(GL_RGBA16F, 4, GL_RGBA, GL_HALF_FLOAT, reference);

			/* half float component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLhalf, true>(GL_R16F, 1, GL_RED, GL_HALF_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLhalf, true>(GL_RG16F, 2, GL_RG, GL_HALF_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLhalf, true>(GL_RGBA16F, 4, GL_RGBA, GL_HALF_FLOAT, reference);
		}

		{
			/* float component ClearNamedBufferData tests */
			glw::GLfloat reference[4] = { 1.f, 0.f, -2.f, 0.3333333333f };

			is_ok &= TestClearNamedBufferData<glw::GLfloat, false>(GL_R32F, 1, GL_RED, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, false>(GL_RG32F, 2, GL_RG, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, false>(GL_RGB32F, 3, GL_RGB, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, false>(GL_RGBA32F, 4, GL_RGBA, GL_FLOAT, reference);

			/* float component ClearNamedBufferSubData tests */
			is_ok &= TestClearNamedBufferData<glw::GLfloat, true>(GL_R32F, 1, GL_RED, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, true>(GL_RG32F, 2, GL_RG, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, true>(GL_RGB32F, 3, GL_RGB, GL_FLOAT, reference);
			is_ok &= TestClearNamedBufferData<glw::GLfloat, true>(GL_RGBA32F, 4, GL_RGBA, GL_FLOAT, reference);
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}